

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterop.cpp
# Opt level: O0

void anon_unknown.dwarf_d07c3::testInteropMx3(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  float *pfVar4;
  Matrix33<float> v;
  int i;
  int j;
  SimpleMx<float,_3> s;
  Matrix33<float> ref;
  SimpleMx<float,_3> *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int i_00;
  SimpleMx<float,_3> *in_stack_ffffffffffffffc8;
  Matrix33<float> *in_stack_ffffffffffffffd0;
  Matrix33<float> local_24;
  
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "has_double_subscript<SimpleMx<float,3>, float, 3, 3>::value = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "has_double_subscript<SimpleMx<int,3>, float, 3, 3>::value = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "has_double_subscript<SimpleMx<float,3>, float, 4, 4>::value = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "has_double_subscript<xyzw<float>, float, 3, 3>::value = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "has_double_subscript<xyz_wrong<float>, float, 3, 3>::value = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  std::operator<<(poVar3,"\n");
  std::operator<<((ostream *)&std::cout,"\n");
  Imath_3_2::Matrix33<float>::Matrix33(&local_24);
  SimpleMx<float,_3>::SimpleMx((SimpleMx<float,_3> *)&stack0xffffffffffffffb8,0.0);
  for (i_00 = 0; i_00 < 3; i_00 = i_00 + 1) {
    for (in_stack_ffffffffffffffb0 = 0; in_stack_ffffffffffffffb0 < 3;
        in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 + 1) {
      iVar2 = in_stack_ffffffffffffffb0 + i_00 * 3;
      pfVar4 = SimpleMx<float,_3>::operator[]((SimpleMx<float,_3> *)&stack0xffffffffffffffb8,i_00);
      pfVar4[in_stack_ffffffffffffffb0] = (float)iVar2;
      iVar2 = in_stack_ffffffffffffffb0 + i_00 * 3;
      pfVar4 = Imath_3_2::Matrix33<float>::operator[](&local_24,i_00);
      pfVar4[in_stack_ffffffffffffffb0] = (float)iVar2;
    }
  }
  Imath_3_2::Matrix33<float>::Matrix33<(anonymous_namespace)::SimpleMx<float,_3>,_0>
            ((Matrix33<float> *)CONCAT44(i_00,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8);
  pfVar4 = Imath_3_2::Matrix33<float>::operator[]((Matrix33<float> *)&stack0xffffffffffffff8c,0);
  bVar1 = false;
  if ((*pfVar4 == 0.0) && (!NAN(*pfVar4))) {
    pfVar4 = Imath_3_2::Matrix33<float>::operator[]((Matrix33<float> *)&stack0xffffffffffffff8c,0);
    bVar1 = false;
    if ((pfVar4[1] == 1.0) && (!NAN(pfVar4[1]))) {
      pfVar4 = Imath_3_2::Matrix33<float>::operator[]((Matrix33<float> *)&stack0xffffffffffffff8c,0)
      ;
      bVar1 = false;
      if ((pfVar4[2] == 2.0) && (!NAN(pfVar4[2]))) {
        pfVar4 = Imath_3_2::Matrix33<float>::operator[]
                           ((Matrix33<float> *)&stack0xffffffffffffff8c,1);
        bVar1 = false;
        if ((*pfVar4 == 3.0) && (!NAN(*pfVar4))) {
          pfVar4 = Imath_3_2::Matrix33<float>::operator[]
                             ((Matrix33<float> *)&stack0xffffffffffffff8c,1);
          bVar1 = false;
          if ((pfVar4[1] == 4.0) && (!NAN(pfVar4[1]))) {
            pfVar4 = Imath_3_2::Matrix33<float>::operator[]
                               ((Matrix33<float> *)&stack0xffffffffffffff8c,1);
            bVar1 = false;
            if ((pfVar4[2] == 5.0) && (!NAN(pfVar4[2]))) {
              pfVar4 = Imath_3_2::Matrix33<float>::operator[]
                                 ((Matrix33<float> *)&stack0xffffffffffffff8c,2);
              bVar1 = false;
              if ((*pfVar4 == 6.0) && (!NAN(*pfVar4))) {
                pfVar4 = Imath_3_2::Matrix33<float>::operator[]
                                   ((Matrix33<float> *)&stack0xffffffffffffff8c,2);
                bVar1 = false;
                if ((pfVar4[1] == 7.0) && (!NAN(pfVar4[1]))) {
                  pfVar4 = Imath_3_2::Matrix33<float>::operator[]
                                     ((Matrix33<float> *)&stack0xffffffffffffff8c,2);
                  bVar1 = pfVar4[2] == 8.0;
                }
              }
            }
          }
        }
      }
    }
  }
  if (!bVar1) {
    __assert_fail("v[0][0] == 0 && v[0][1] == 1 && v[0][2] == 2 && v[1][0] == 3 && v[1][1] == 4 && v[1][2] == 5 && v[2][0] == 6 && v[2][1] == 7 && v[2][2] == 8"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterop.cpp"
                  ,0x27d,"void (anonymous namespace)::testInteropMx3()");
  }
  pfVar4 = SimpleMx<float,_3>::operator[]((SimpleMx<float,_3> *)&stack0xffffffffffffffb8,1);
  pfVar4[1] = 42.0;
  Imath_3_2::Matrix33<float>::operator=<(anonymous_namespace)::SimpleMx<float,_3>,_0>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  pfVar4 = Imath_3_2::Matrix33<float>::operator[]((Matrix33<float> *)&stack0xffffffffffffff8c,0);
  bVar1 = false;
  if ((*pfVar4 == 0.0) && (!NAN(*pfVar4))) {
    pfVar4 = Imath_3_2::Matrix33<float>::operator[]((Matrix33<float> *)&stack0xffffffffffffff8c,0);
    bVar1 = false;
    if ((pfVar4[1] == 1.0) && (!NAN(pfVar4[1]))) {
      pfVar4 = Imath_3_2::Matrix33<float>::operator[]((Matrix33<float> *)&stack0xffffffffffffff8c,0)
      ;
      bVar1 = false;
      if ((pfVar4[2] == 2.0) && (!NAN(pfVar4[2]))) {
        pfVar4 = Imath_3_2::Matrix33<float>::operator[]
                           ((Matrix33<float> *)&stack0xffffffffffffff8c,1);
        bVar1 = false;
        if ((*pfVar4 == 3.0) && (!NAN(*pfVar4))) {
          pfVar4 = Imath_3_2::Matrix33<float>::operator[]
                             ((Matrix33<float> *)&stack0xffffffffffffff8c,1);
          bVar1 = false;
          if ((pfVar4[1] == 42.0) && (!NAN(pfVar4[1]))) {
            pfVar4 = Imath_3_2::Matrix33<float>::operator[]
                               ((Matrix33<float> *)&stack0xffffffffffffff8c,1);
            bVar1 = false;
            if ((pfVar4[2] == 5.0) && (!NAN(pfVar4[2]))) {
              pfVar4 = Imath_3_2::Matrix33<float>::operator[]
                                 ((Matrix33<float> *)&stack0xffffffffffffff8c,2);
              bVar1 = false;
              if ((*pfVar4 == 6.0) && (!NAN(*pfVar4))) {
                pfVar4 = Imath_3_2::Matrix33<float>::operator[]
                                   ((Matrix33<float> *)&stack0xffffffffffffff8c,2);
                bVar1 = false;
                if ((pfVar4[1] == 7.0) && (!NAN(pfVar4[1]))) {
                  pfVar4 = Imath_3_2::Matrix33<float>::operator[]
                                     ((Matrix33<float> *)&stack0xffffffffffffff8c,2);
                  bVar1 = pfVar4[2] == 8.0;
                }
              }
            }
          }
        }
      }
    }
  }
  if (!bVar1) {
    __assert_fail("v[0][0] == 0 && v[0][1] == 1 && v[0][2] == 2 && v[1][0] == 3 && v[1][1] == 42 && v[1][2] == 5 && v[2][0] == 6 && v[2][1] == 7 && v[2][2] == 8"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterop.cpp"
                  ,0x283,"void (anonymous namespace)::testInteropMx3()");
  }
  return;
}

Assistant:

void
testInteropMx3 ()
{
    std::cout
        << "has_double_subscript<SimpleMx<float,3>, float, 3, 3>::value = "
        << has_double_subscript<SimpleMx<float, 3>, float, 3, 3>::value << "\n";
    std::cout << "has_double_subscript<SimpleMx<int,3>, float, 3, 3>::value = "
              << has_double_subscript<SimpleMx<int, 3>, float, 3, 3>::value
              << "\n";
    std::cout
        << "has_double_subscript<SimpleMx<float,3>, float, 4, 4>::value = "
        << has_double_subscript<SimpleMx<float, 3>, float, 4, 4>::value << "\n";
    std::cout << "has_double_subscript<xyzw<float>, float, 3, 3>::value = "
              << has_double_subscript<xyzw<float>, float, 3, 3>::value << "\n";
    std::cout << "has_double_subscript<xyz_wrong<float>, float, 3, 3>::value = "
              << has_double_subscript<xyz_wrong<float>, float, 3, 3>::value
              << "\n";
    std::cout << "\n";

    assert ((has_double_subscript<SimpleMx<float, 3>, float, 3, 3>::value));
    assert ((!has_double_subscript<SimpleMx<float, 3>, float, 4, 4>::value));
    assert ((!has_double_subscript<SimpleMx<float, 3>, int, 3, 3>::value));
    assert ((!has_double_subscript<xyzw<float>, float, 3, 3>::value));
    assert ((!has_double_subscript<xy<float>, float, 3, 3>::value));

    // Test construction/assignment/paramater pass of a vector type with
    // subscripting to access components.
    {
        Matrix33<float>    ref;
        SimpleMx<float, 3> s;
        for (int j = 0; j < 3; ++j)
            for (int i = 0; i < 3; ++i)
            {
                s[j][i]   = float(i + j * 3);
                ref[j][i] = float(i + j * 3);
            }
        Matrix33<float> v (s);
        assert (
            v[0][0] == 0 && v[0][1] == 1 && v[0][2] == 2 && v[1][0] == 3 &&
            v[1][1] == 4 && v[1][2] == 5 && v[2][0] == 6 && v[2][1] == 7 &&
            v[2][2] == 8);
        s[1][1] = 42;
        v       = s;
        assert (
            v[0][0] == 0 && v[0][1] == 1 && v[0][2] == 2 && v[1][0] == 3 &&
            v[1][1] == 42 && v[1][2] == 5 && v[2][0] == 6 && v[2][1] == 7 &&
            v[2][2] == 8);
    }
}